

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void mi_process_init(void)

{
  _Bool _Var1;
  mi_threadid_t mVar2;
  long lVar3;
  long ksize;
  long reserve_at;
  size_t pages;
  size_t in_stack_00000038;
  size_t in_stack_00000040;
  size_t in_stack_00000048;
  undefined8 in_stack_ffffffffffffffe8;
  mi_option_t option;
  size_t in_stack_fffffffffffffff0;
  
  option = (mi_option_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  mi_heap_main_init();
  _Var1 = mi_atomic_once(&mi_process_init::process_init);
  if (_Var1) {
    _mi_process_is_initialized = true;
    mVar2 = _mi_thread_id();
    _mi_verbose_message("process init: 0x%zx\n",mVar2);
    mi_process_setup_auto_thread_done();
    mi_detect_cpu_features();
    _mi_os_init();
    mi_heap_main_init();
    mi_thread_init();
    mi_stats_reset();
    _Var1 = mi_option_is_enabled(mi_option_show_errors);
    if (_Var1) {
      mi_option_get_clamp(pages._4_4_,reserve_at,ksize);
      in_stack_fffffffffffffff0 = mi_option_get(option);
      if (in_stack_fffffffffffffff0 == 0xffffffffffffffff) {
        mi_reserve_huge_os_pages_interleave(in_stack_00000048,in_stack_00000040,in_stack_00000038);
      }
      else {
        mi_reserve_huge_os_pages_at(in_stack_fffffffffffffff0,option,0xac6292);
      }
    }
    _Var1 = mi_option_is_enabled(mi_option_show_errors);
    if ((_Var1) && (lVar3 = mi_option_get(option), 0 < lVar3)) {
      mi_reserve_os_memory
                (in_stack_fffffffffffffff0,SUB81((ulong)lVar3 >> 0x38,0),
                 SUB81((ulong)lVar3 >> 0x30,0));
    }
  }
  return;
}

Assistant:

void mi_process_init(void) mi_attr_noexcept {
  // ensure we are called once
  static mi_atomic_once_t process_init;
	#if _MSC_VER < 1920
	mi_heap_main_init(); // vs2017 can dynamically re-initialize _mi_heap_main
	#endif
  if (!mi_atomic_once(&process_init)) return;
  _mi_process_is_initialized = true;
  _mi_verbose_message("process init: 0x%zx\n", _mi_thread_id());
  mi_process_setup_auto_thread_done();

  mi_detect_cpu_features();
  _mi_os_init();
  mi_heap_main_init();
  mi_thread_init();

  #if defined(_WIN32)
  // On windows, when building as a static lib the FLS cleanup happens to early for the main thread.
  // To avoid this, set the FLS value for the main thread to NULL so the fls cleanup
  // will not call _mi_thread_done on the (still executing) main thread. See issue #508.
  _mi_prim_thread_associate_default_heap(NULL);
  #endif

  mi_stats_reset();  // only call stat reset *after* thread init (or the heap tld == NULL)
  mi_track_init();

  if (mi_option_is_enabled(mi_option_reserve_huge_os_pages)) {
    size_t pages = mi_option_get_clamp(mi_option_reserve_huge_os_pages, 0, 128*1024);
    long reserve_at = mi_option_get(mi_option_reserve_huge_os_pages_at);
    if (reserve_at != -1) {
      mi_reserve_huge_os_pages_at(pages, reserve_at, pages*500);
    } else {
      mi_reserve_huge_os_pages_interleave(pages, 0, pages*500);
    }
  }
  if (mi_option_is_enabled(mi_option_reserve_os_memory)) {
    long ksize = mi_option_get(mi_option_reserve_os_memory);
    if (ksize > 0) {
      mi_reserve_os_memory((size_t)ksize*MI_KiB, true /* commit? */, true /* allow large pages? */);
    }
  }
}